

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c++
# Opt level: O3

void __thiscall
capnp::_::BuilderArena::BuilderArena
          (BuilderArena *this,MessageBuilder *message,
          ArrayPtr<capnp::MessageBuilder::SegmentInit> segments)

{
  ArrayPtr<const_capnp::word> *pAVar1;
  _ *p_Var2;
  size_t *psVar3;
  Disposer *pDVar4;
  MultiSegmentState *pMVar5;
  Own<capnp::_::SegmentBuilder,_std::nullptr_t> *pOVar6;
  RemoveConst<kj::Own<capnp::_::SegmentBuilder>_> *pRVar7;
  Own<capnp::_::SegmentBuilder,_std::nullptr_t> *pOVar8;
  RemoveConst<kj::ArrayPtr<const_capnp::word>_> *pRVar9;
  ArrayPtr<const_capnp::word> *pAVar10;
  ArrayDisposer *pAVar11;
  anon_class_8_1_89918cff aVar12;
  ArrayPtr<const_capnp::word> *pAVar13;
  SegmentWordCount SVar14;
  SegmentBuilder *pSVar15;
  MultiSegmentState *pMVar16;
  ulong uVar17;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t extraout_RDX_01;
  uint uVar18;
  size_t sVar19;
  SegmentBuilder *ptrCopy;
  SegmentInit *pSVar20;
  ArrayPtr<const_capnp::word> segment;
  ArrayPtr<const_capnp::word> segment_00;
  Vector<kj::Own<capnp::_::SegmentBuilder,_std::nullptr_t>_> builders;
  Vector<kj::ArrayPtr<const_capnp::word>_> forOutput;
  Vector<kj::Own<capnp::_::SegmentBuilder,_std::nullptr_t>_> local_d8;
  SegmentInit *local_b0;
  Vector<kj::ArrayPtr<const_capnp::word>_> local_a8;
  anon_class_8_1_89918cff local_88;
  Own<capnp::_::SegmentBuilder,_std::nullptr_t> *pOStack_80;
  Own<capnp::_::SegmentBuilder,_std::nullptr_t> *local_78;
  ArrayDisposer *pAStack_70;
  ArrayPtr<const_capnp::word> *local_68;
  ArrayPtr<const_capnp::word> *pAStack_60;
  ArrayPtr<const_capnp::word> *local_58;
  ArrayDisposer *local_50;
  Own<capnp::_::SegmentBuilder,_std::nullptr_t> *local_48;
  ArrayDisposer *pAStack_40;
  ulong local_38;
  
  uVar17 = segments.size_;
  segment.size_ = segments.ptr;
  (this->super_Arena)._vptr_Arena = (_func_int **)&PTR__BuilderArena_006d4330;
  this->message = message;
  (this->dummyLimiter).limit = 0xffffffffffffffff;
  (this->localCapTable).super_CapTableBuilder.super_CapTableReader._vptr_CapTableReader =
       (_func_int **)&PTR_extractCap_006d43e8;
  (this->localCapTable).capTable.builder.ptr =
       (Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_> *)0x0;
  (this->localCapTable).capTable.builder.pos =
       (RemoveConst<kj::Maybe<kj::Own<capnp::ClientHook>_>_> *)0x0;
  (this->localCapTable).capTable.builder.endPtr =
       (Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_> *)0x0;
  (this->localCapTable).capTable.builder.disposer =
       (ArrayDisposer *)&kj::NullArrayDisposer::instance;
  p_Var2 = (_ *)((segment.size_)->space).ptr;
  segment.ptr = (word *)((segment.size_)->space).size_;
  SVar14 = verifySegment(p_Var2,segment);
  local_88.size = (size_t *)(segment.size_)->wordsUsed;
  if ((size_t *)0x1fffffff < local_88.size) {
    anon_func::anon_class_8_1_89918cff::operator()(&local_88);
  }
  local_48 = (Own<capnp::_::SegmentBuilder,_std::nullptr_t> *)&this->dummyLimiter;
  (this->segment0).super_SegmentReader.arena = &this->super_Arena;
  (this->segment0).super_SegmentReader.id.value = 0;
  (this->segment0).super_SegmentReader.ptr.ptr = (word *)p_Var2;
  (this->segment0).super_SegmentReader.ptr.size_ = (ulong)SVar14;
  (this->segment0).super_SegmentReader.readLimiter = (ReadLimiter *)local_48;
  (this->segment0).pos = (word *)(p_Var2 + (long)local_88.size * 8);
  (this->segment0).readOnly = false;
  (this->segment0ForOutput).ptr = (word *)0x0;
  (this->segment0ForOutput).size_ = 0;
  (this->moreSegments).ptr.disposer = (Disposer *)0x0;
  (this->moreSegments).ptr.ptr = (MultiSegmentState *)0x0;
  this->segmentWithSpace = (SegmentBuilder *)0x0;
  if (uVar17 < 2) {
    this->segmentWithSpace = &this->segment0;
  }
  else {
    local_d8.builder.ptr =
         (Own<capnp::_::SegmentBuilder,_std::nullptr_t> *)
         kj::_::HeapArrayDisposer::allocateImpl
                   (0x10,0,uVar17 - 1,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
    local_d8.builder.endPtr = local_d8.builder.ptr + (uVar17 - 1);
    local_d8.builder.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
    local_b0 = (SegmentInit *)(uVar17 * 0x18);
    local_d8.builder.pos = local_d8.builder.ptr;
    local_38 = uVar17;
    if (local_b0 != (SegmentInit *)0x18) {
      local_b0 = (SegmentInit *)((long)&(local_b0->space).ptr + (long)&((segment.size_)->space).ptr)
      ;
      pSVar20 = segment.size_ + 1;
      uVar18 = 1;
      sVar19 = extraout_RDX;
      do {
        p_Var2 = (_ *)(pSVar20->space).ptr;
        segment_00.size_ = sVar19;
        segment_00.ptr = (word *)(pSVar20->space).size_;
        SVar14 = verifySegment(p_Var2,segment_00);
        psVar3 = (size_t *)pSVar20->wordsUsed;
        local_88.size = psVar3;
        if ((size_t *)0x1fffffff < psVar3) {
          anon_func::anon_class_8_1_89918cff::operator()(&local_88);
        }
        pSVar15 = (SegmentBuilder *)operator_new(0x38);
        (pSVar15->super_SegmentReader).arena = &this->super_Arena;
        (pSVar15->super_SegmentReader).id.value = uVar18;
        (pSVar15->super_SegmentReader).ptr.ptr = (word *)p_Var2;
        (pSVar15->super_SegmentReader).ptr.size_ = (ulong)SVar14;
        (pSVar15->super_SegmentReader).readLimiter = (ReadLimiter *)local_48;
        pSVar15->pos = (word *)(p_Var2 + (long)psVar3 * 8);
        pSVar15->readOnly = false;
        sVar19 = extraout_RDX_00;
        if (local_d8.builder.pos == local_d8.builder.endPtr) {
          sVar19 = (long)local_d8.builder.pos - (long)local_d8.builder.ptr >> 3;
          if (local_d8.builder.pos == local_d8.builder.ptr) {
            sVar19 = 4;
          }
          kj::Vector<kj::Own<capnp::_::SegmentBuilder,_std::nullptr_t>_>::setCapacity
                    (&local_d8,sVar19);
          sVar19 = extraout_RDX_01;
        }
        (local_d8.builder.pos)->disposer =
             (Disposer *)&kj::_::HeapDisposer<capnp::_::SegmentBuilder>::instance;
        (local_d8.builder.pos)->ptr = pSVar15;
        local_d8.builder.pos = local_d8.builder.pos + 1;
        pSVar20 = pSVar20 + 1;
        uVar18 = uVar18 + 1;
      } while (pSVar20 != local_b0);
    }
    uVar17 = local_38;
    local_a8.builder.ptr = (ArrayPtr<const_capnp::word> *)0x0;
    local_a8.builder.pos = (ArrayPtr<const_capnp::word> *)0x0;
    local_a8.builder.endPtr = (ArrayPtr<const_capnp::word> *)0x0;
    local_a8.builder.disposer = (ArrayDisposer *)&kj::NullArrayDisposer::instance;
    sVar19 = 4;
    if (4 < local_38) {
      sVar19 = local_38;
    }
    kj::Vector<kj::ArrayPtr<const_capnp::word>_>::setCapacity(&local_a8,sVar19);
    pAVar11 = local_a8.builder.disposer;
    pAVar10 = local_a8.builder.endPtr;
    pRVar7 = local_d8.builder.pos;
    pOVar6 = local_d8.builder.ptr;
    pAVar1 = local_a8.builder.ptr + uVar17;
    while (local_a8.builder.pos < local_a8.builder.ptr + uVar17) {
      (local_a8.builder.pos)->ptr = (word *)0x0;
      (local_a8.builder.pos)->size_ = 0;
      pAVar1 = local_a8.builder.pos + 1;
      local_a8.builder.pos = pAVar1;
    }
    local_b0 = (SegmentInit *)local_a8.builder.ptr;
    this->segmentWithSpace = local_d8.builder.pos[-1].ptr;
    local_88.size = (size_t *)local_d8.builder.ptr;
    pOStack_80 = local_d8.builder.pos;
    local_48 = local_d8.builder.endPtr;
    pAStack_40 = local_d8.builder.disposer;
    local_78 = local_d8.builder.endPtr;
    pAStack_70 = local_d8.builder.disposer;
    local_d8.builder.ptr = (Own<capnp::_::SegmentBuilder,_std::nullptr_t> *)0x0;
    local_d8.builder.pos = (RemoveConst<kj::Own<capnp::_::SegmentBuilder>_> *)0x0;
    local_d8.builder.endPtr = (Own<capnp::_::SegmentBuilder,_std::nullptr_t> *)0x0;
    local_68 = local_a8.builder.ptr;
    local_58 = local_a8.builder.endPtr;
    local_50 = local_a8.builder.disposer;
    local_a8.builder.ptr = (ArrayPtr<const_capnp::word> *)0x0;
    local_a8.builder.pos = (RemoveConst<kj::ArrayPtr<const_capnp::word>_> *)0x0;
    local_a8.builder.endPtr = (ArrayPtr<const_capnp::word> *)0x0;
    pAStack_60 = pAVar1;
    pMVar16 = (MultiSegmentState *)operator_new(0x40);
    (pMVar16->builders).builder.endPtr = local_48;
    (pMVar16->builders).builder.disposer = pAStack_40;
    (pMVar16->builders).builder.ptr = pOVar6;
    (pMVar16->builders).builder.pos = pRVar7;
    local_78 = (Own<capnp::_::SegmentBuilder,_std::nullptr_t> *)0x0;
    local_88.size = (size_t *)0x0;
    pOStack_80 = (Own<capnp::_::SegmentBuilder,_std::nullptr_t> *)0x0;
    (pMVar16->forOutput).builder.ptr = (ArrayPtr<const_capnp::word> *)local_b0;
    (pMVar16->forOutput).builder.pos = pAVar1;
    (pMVar16->forOutput).builder.endPtr = pAVar10;
    (pMVar16->forOutput).builder.disposer = pAVar11;
    local_58 = (ArrayPtr<const_capnp::word> *)0x0;
    local_68 = (ArrayPtr<const_capnp::word> *)0x0;
    pAStack_60 = (ArrayPtr<const_capnp::word> *)0x0;
    pDVar4 = (this->moreSegments).ptr.disposer;
    pMVar5 = (this->moreSegments).ptr.ptr;
    (this->moreSegments).ptr.disposer =
         (Disposer *)&kj::_::HeapDisposer<capnp::_::BuilderArena::MultiSegmentState>::instance;
    (this->moreSegments).ptr.ptr = pMVar16;
    if ((pMVar5 != (MultiSegmentState *)0x0) &&
       ((**pDVar4->_vptr_Disposer)(), pAVar13 = local_58, pAVar10 = pAStack_60, pAVar1 = local_68,
       local_68 != (ArrayPtr<const_capnp::word> *)0x0)) {
      local_68 = (ArrayPtr<const_capnp::word> *)0x0;
      pAStack_60 = (ArrayPtr<const_capnp::word> *)0x0;
      local_58 = (ArrayPtr<const_capnp::word> *)0x0;
      (**local_50->_vptr_ArrayDisposer)
                (local_50,pAVar1,0x10,(long)pAVar10 - (long)pAVar1 >> 4,
                 (long)pAVar13 - (long)pAVar1 >> 4,0);
    }
    pOVar8 = local_78;
    pOVar6 = pOStack_80;
    aVar12.size = local_88.size;
    if (local_88.size != (size_t *)0x0) {
      local_88.size = (size_t *)0x0;
      pOStack_80 = (Own<capnp::_::SegmentBuilder,_std::nullptr_t> *)0x0;
      local_78 = (Own<capnp::_::SegmentBuilder,_std::nullptr_t> *)0x0;
      (**pAStack_70->_vptr_ArrayDisposer)
                (pAStack_70,aVar12.size,0x10,(long)pOVar6 - (long)aVar12.size >> 4,
                 (long)pOVar8 - (long)aVar12.size >> 4,
                 kj::ArrayDisposer::Dispose_<kj::Own<capnp::_::SegmentBuilder,_std::nullptr_t>_>::
                 destruct);
    }
    pAVar10 = local_a8.builder.endPtr;
    pRVar9 = local_a8.builder.pos;
    pAVar1 = local_a8.builder.ptr;
    if (local_a8.builder.ptr != (ArrayPtr<const_capnp::word> *)0x0) {
      local_a8.builder.ptr = (ArrayPtr<const_capnp::word> *)0x0;
      local_a8.builder.pos = (RemoveConst<kj::ArrayPtr<const_capnp::word>_> *)0x0;
      local_a8.builder.endPtr = (ArrayPtr<const_capnp::word> *)0x0;
      (**(local_a8.builder.disposer)->_vptr_ArrayDisposer)
                (local_a8.builder.disposer,pAVar1,0x10,(long)pRVar9 - (long)pAVar1 >> 4,
                 (long)pAVar10 - (long)pAVar1 >> 4,0);
    }
    pOVar8 = local_d8.builder.endPtr;
    pRVar7 = local_d8.builder.pos;
    pOVar6 = local_d8.builder.ptr;
    if (local_d8.builder.ptr != (Own<capnp::_::SegmentBuilder,_std::nullptr_t> *)0x0) {
      local_d8.builder.ptr = (Own<capnp::_::SegmentBuilder,_std::nullptr_t> *)0x0;
      local_d8.builder.pos = (RemoveConst<kj::Own<capnp::_::SegmentBuilder>_> *)0x0;
      local_d8.builder.endPtr = (Own<capnp::_::SegmentBuilder,_std::nullptr_t> *)0x0;
      (**(local_d8.builder.disposer)->_vptr_ArrayDisposer)
                (local_d8.builder.disposer,pOVar6,0x10,(long)pRVar7 - (long)pOVar6 >> 4,
                 (long)pOVar8 - (long)pOVar6 >> 4,
                 kj::ArrayDisposer::Dispose_<kj::Own<capnp::_::SegmentBuilder,_std::nullptr_t>_>::
                 destruct);
    }
  }
  return;
}

Assistant:

BuilderArena::BuilderArena(MessageBuilder* message,
                           kj::ArrayPtr<MessageBuilder::SegmentInit> segments)
    : message(message),
      segment0(this, SegmentId(0), segments[0].space.begin(),
               verifySegment(segments[0].space),
               &this->dummyLimiter, verifySegmentSize(segments[0].wordsUsed)) {
  if (segments.size() > 1) {
    kj::Vector<kj::Own<SegmentBuilder>> builders(segments.size() - 1);

    uint i = 1;
    for (auto& segment: segments.slice(1, segments.size())) {
      builders.add(kj::heap<SegmentBuilder>(
          this, SegmentId(i++), segment.space.begin(), verifySegment(segment.space),
          &this->dummyLimiter, verifySegmentSize(segment.wordsUsed)));
    }

    kj::Vector<kj::ArrayPtr<const word>> forOutput;
    forOutput.resize(segments.size());

    segmentWithSpace = builders.back();

    this->moreSegments = kj::heap<MultiSegmentState>(
        MultiSegmentState { kj::mv(builders), kj::mv(forOutput) });

  } else {
    segmentWithSpace = &segment0;
  }
}